

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O1

bool __thiscall Json::Value::operator<(Value *this,Value *other)

{
  byte bVar1;
  ObjectValues *pOVar2;
  ObjectValues *pOVar3;
  char *__s1;
  char *__s2;
  bool bVar4;
  int iVar5;
  
  bVar1 = this->field_0x8;
  if (bVar1 != other->field_0x8) {
    return bVar1 < (byte)other->field_0x8;
  }
  switch(bVar1) {
  case 1:
    bVar4 = (this->value_).int_ < (other->value_).int_;
    break;
  case 2:
    bVar4 = (this->value_).uint_ < (other->value_).uint_;
    break;
  case 3:
    bVar4 = (this->value_).real_ <= (other->value_).real_ &&
            (other->value_).real_ != (this->value_).real_;
    break;
  case 4:
    __s1 = (this->value_).string_;
    __s2 = (other->value_).string_;
    if (__s2 == (char *)0x0 || __s1 == (char *)0x0) {
      return __s1 == (char *)0x0 && __s2 != (char *)0x0;
    }
    if (__s1 != (char *)0x0) {
      iVar5 = strcmp(__s1,__s2);
      goto LAB_004f5632;
    }
  case 0:
    bVar4 = false;
    break;
  case 5:
    bVar4 = (this->value_).bool_ < (other->value_).bool_;
    break;
  case 6:
  case 7:
    pOVar2 = (this->value_).map_;
    pOVar3 = (other->value_).map_;
    iVar5 = (int)(pOVar2->_M_t)._M_impl.super__Rb_tree_header._M_node_count -
            (int)(pOVar3->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    if (iVar5 == 0) {
      bVar4 = std::
              __lexicographical_compare_impl<std::_Rb_tree_const_iterator<std::pair<Json::Value::CZString_const,Json::Value>>,std::_Rb_tree_const_iterator<std::pair<Json::Value::CZString_const,Json::Value>>,__gnu_cxx::__ops::_Iter_less_iter>
                        ((pOVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
                         &(pOVar2->_M_t)._M_impl.super__Rb_tree_header,
                         (pOVar3->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
                         &(pOVar3->_M_t)._M_impl.super__Rb_tree_header);
      return bVar4;
    }
LAB_004f5632:
    bVar4 = SUB41((uint)iVar5 >> 0x1f,0);
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Utilities/cmjsoncpp/src/lib_json/json_value.cpp"
                  ,0x1d9,"bool Json::Value::operator<(const Value &) const");
  }
  return bVar4;
}

Assistant:

bool Value::operator<(const Value& other) const {
  int typeDelta = type_ - other.type_;
  if (typeDelta)
    return typeDelta < 0 ? true : false;
  switch (type_) {
  case nullValue:
    return false;
  case intValue:
    return value_.int_ < other.value_.int_;
  case uintValue:
    return value_.uint_ < other.value_.uint_;
  case realValue:
    return value_.real_ < other.value_.real_;
  case booleanValue:
    return value_.bool_ < other.value_.bool_;
  case stringValue:
    return (value_.string_ == 0 && other.value_.string_) ||
           (other.value_.string_ && value_.string_ &&
            strcmp(value_.string_, other.value_.string_) < 0);
#ifndef JSON_VALUE_USE_INTERNAL_MAP
  case arrayValue:
  case objectValue: {
    int delta = int(value_.map_->size() - other.value_.map_->size());
    if (delta)
      return delta < 0;
    return (*value_.map_) < (*other.value_.map_);
  }
#else
  case arrayValue:
    return value_.array_->compare(*(other.value_.array_)) < 0;
  case objectValue:
    return value_.map_->compare(*(other.value_.map_)) < 0;
#endif
  default:
    JSON_ASSERT_UNREACHABLE;
  }
  return false; // unreachable
}